

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cpp
# Opt level: O0

bool __thiscall
slang::ast::ConstraintExprVisitor::visit<slang::ast::InvalidExpression>
          (ConstraintExprVisitor *this,InvalidExpression *expr)

{
  BinaryOperator BVar1;
  FormalArgumentSymbol *pFVar2;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  SourceRange sourceRange_02;
  SourceRange sourceRange_03;
  SourceRange sourceRange_04;
  SourceRange sourceRange_05;
  SourceRange sourceRange_06;
  SourceRange sourceRange_07;
  bool bVar3;
  LanguageVersion LVar4;
  SubroutineKind SVar5;
  Expression *pEVar6;
  DistExpression *this_00;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *ppSVar7;
  reference ppFVar8;
  ulong uVar9;
  Expression *in_RSI;
  ConstraintExprVisitor *in_RDI;
  FormalArgumentSymbol *arg;
  iterator __end6;
  iterator __begin6;
  ArgList *__range6;
  SubroutineSymbol *sub;
  CallExpression *call;
  Expression *left;
  DistVarVisitor distVisitor;
  BinaryExpression *binExpr;
  bool childrenHaveRand;
  RandMode mode;
  Symbol *sym;
  SubroutineSymbol *in_stack_fffffffffffffe38;
  Expression *in_stack_fffffffffffffe40;
  undefined2 in_stack_fffffffffffffe48;
  undefined1 in_stack_fffffffffffffe4a;
  undefined1 in_stack_fffffffffffffe4b;
  byte bVar10;
  undefined4 in_stack_fffffffffffffe4c;
  SVInt *in_stack_fffffffffffffe50;
  SVInt *pSVar11;
  undefined7 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5f;
  Expression *in_stack_fffffffffffffe60;
  undefined7 in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe6f;
  undefined8 in_stack_fffffffffffffe70;
  DiagCode DVar12;
  undefined8 in_stack_fffffffffffffe80;
  undefined1 allowPacked;
  Expression *in_stack_fffffffffffffe88;
  undefined2 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe92;
  bitmask<slang::ast::VariableFlags> in_stack_fffffffffffffe96;
  ASTContext *in_stack_fffffffffffffe98;
  __normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
  local_158;
  ArgList local_150;
  ArgList *local_140;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> local_138;
  SourceLocation local_130;
  SourceLocation local_128;
  undefined4 local_11c;
  CallExpression *local_118;
  SourceLocation local_110;
  SourceLocation local_108;
  undefined4 local_fc;
  Expression *local_f8;
  DistVarVisitor local_f0;
  SourceLocation local_e0;
  SourceLocation local_d8;
  undefined4 local_cc;
  BinaryExpression *local_c8;
  SourceLocation local_c0;
  SourceLocation local_b8;
  undefined4 local_ac;
  SVInt local_a8;
  SourceLocation local_98;
  SourceLocation local_90;
  undefined4 local_88;
  SVInt local_78;
  SourceLocation local_68;
  SourceLocation local_60;
  undefined4 local_54;
  SourceLocation local_50;
  SourceLocation local_48;
  undefined4 local_3e;
  byte local_39;
  SourceLocation local_38;
  SourceLocation local_30;
  undefined4 local_28;
  RandMode local_24;
  Symbol *local_20;
  Expression *local_18;
  bool local_1;
  
  DVar12 = SUB84((ulong)in_stack_fffffffffffffe70 >> 0x20,0);
  allowPacked = (undefined1)((ulong)in_stack_fffffffffffffe80 >> 0x38);
  if (((in_RDI->failed & 1U) != 0) ||
     (local_18 = in_RSI, bVar3 = Expression::bad(in_stack_fffffffffffffe40), bVar3)) {
    bVar3 = fail(in_RDI);
    return bVar3;
  }
  local_20 = Expression::getSymbolReference(in_stack_fffffffffffffe88,(bool)allowPacked);
  if (local_20 != (Symbol *)0x0) {
    local_24 = ASTContext::getRandMode
                         (in_stack_fffffffffffffe98,
                          (Symbol *)
                          CONCAT26(in_stack_fffffffffffffe96.m_bits,
                                   CONCAT42(in_stack_fffffffffffffe92,in_stack_fffffffffffffe90)));
    if (local_24 != None) {
      in_RDI->sawRandVars = true;
    }
    if (((in_RDI->isSoft & 1U) != 0) && (local_24 == RandC)) {
      local_28 = 0x390008;
      local_38 = (local_18->sourceRange).startLoc;
      local_30 = (local_18->sourceRange).endLoc;
      sourceRange.endLoc._0_7_ = in_stack_fffffffffffffe68;
      sourceRange.startLoc = (SourceLocation)in_stack_fffffffffffffe60;
      sourceRange.endLoc._7_1_ = in_stack_fffffffffffffe6f;
      ASTContext::addDiag((ASTContext *)
                          CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),DVar12,
                          sourceRange);
    }
  }
  local_39 = 0;
  uVar9 = (ulong)(local_18->kind - IntegerLiteral);
  switch(uVar9) {
  case 0:
    Expression::as<slang::ast::IntegerLiteral>(local_18);
    DVar12 = SUB84(uVar9 >> 0x20,0);
    pSVar11 = &local_78;
    IntegerLiteral::getValue((IntegerLiteral *)in_stack_fffffffffffffe38);
    bVar10 = SVInt::hasUnknown(pSVar11);
    SVInt::~SVInt(in_stack_fffffffffffffe50);
    if ((bVar10 & 1) == 0) {
      return true;
    }
    local_88 = 0x500008;
    local_98 = (local_18->sourceRange).startLoc;
    local_90 = (local_18->sourceRange).endLoc;
    sourceRange_02.endLoc._0_7_ = in_stack_fffffffffffffe68;
    sourceRange_02.startLoc = (SourceLocation)pSVar11;
    sourceRange_02.endLoc._7_1_ = bVar10;
    ASTContext::addDiag((ASTContext *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),
                        DVar12,sourceRange_02);
    bVar3 = fail(in_RDI);
    return bVar3;
  case 1:
  case 2:
    ASTContext::getCompilation((ASTContext *)0x96b3e4);
    DVar12 = SUB84(uVar9 >> 0x20,0);
    LVar4 = Compilation::languageVersion((Compilation *)0x96b3ec);
    if ((int)LVar4 < 1) {
      local_54 = 0x2f0008;
      local_68 = (local_18->sourceRange).startLoc;
      local_60 = (local_18->sourceRange).endLoc;
      sourceRange_01.endLoc._0_7_ = in_stack_fffffffffffffe68;
      sourceRange_01.startLoc = (SourceLocation)in_stack_fffffffffffffe60;
      sourceRange_01.endLoc._7_1_ = in_stack_fffffffffffffe6f;
      ASTContext::addDiag((ASTContext *)
                          CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),DVar12,
                          sourceRange_01);
      bVar3 = fail(in_RDI);
      return bVar3;
    }
    break;
  case 3:
    Expression::as<slang::ast::UnbasedUnsizedIntegerLiteral>(local_18);
    DVar12 = SUB84(uVar9 >> 0x20,0);
    pSVar11 = &local_a8;
    UnbasedUnsizedIntegerLiteral::getValue
              ((UnbasedUnsizedIntegerLiteral *)
               CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68));
    bVar10 = SVInt::hasUnknown(pSVar11);
    SVInt::~SVInt(pSVar11);
    if ((bVar10 & 1) == 0) {
      return true;
    }
    local_ac = 0x500008;
    local_c0 = (local_18->sourceRange).startLoc;
    local_b8 = (local_18->sourceRange).endLoc;
    sourceRange_03.endLoc._0_7_ = in_stack_fffffffffffffe68;
    sourceRange_03.startLoc = (SourceLocation)in_stack_fffffffffffffe60;
    sourceRange_03.endLoc._7_1_ = in_stack_fffffffffffffe6f;
    ASTContext::addDiag((ASTContext *)CONCAT17(bVar10,in_stack_fffffffffffffe58),DVar12,
                        sourceRange_03);
    bVar3 = fail(in_RDI);
    return bVar3;
  default:
    break;
  case 7:
  case 8:
    if ((in_RDI->isTop & 1U) == 0) {
      return true;
    }
    break;
  case 10:
    local_c8 = Expression::as<slang::ast::BinaryExpression>(local_18);
    BVar1 = local_c8->op;
    if (1 < BVar1 - Equality) {
      if (BVar1 - CaseEquality < 2) {
LAB_0096b6a0:
        local_cc = 0x180008;
        local_e0 = (local_18->sourceRange).startLoc;
        local_d8 = (local_18->sourceRange).endLoc;
        sourceRange_04.endLoc._0_7_ = in_stack_fffffffffffffe68;
        sourceRange_04.startLoc = (SourceLocation)in_stack_fffffffffffffe60;
        sourceRange_04.endLoc._7_1_ = in_stack_fffffffffffffe6f;
        ASTContext::addDiag((ASTContext *)
                            CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),
                            SUB84(uVar9 >> 0x20,0),sourceRange_04);
        bVar3 = fail(in_RDI);
        return bVar3;
      }
      if (3 < BVar1 - GreaterThanEqual) {
        if (BVar1 - WildcardEquality < 2) goto LAB_0096b6a0;
        if (3 < BVar1 - LogicalAnd) break;
      }
    }
    if ((local_39 & 1) != 0) {
      pEVar6 = BinaryExpression::left(local_c8);
      bVar3 = ValueExpressionBase::isKind(pEVar6->kind);
      if (bVar3) {
        BinaryExpression::left(local_c8);
        bVar3 = checkType((ConstraintExprVisitor *)
                          CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68),
                          in_stack_fffffffffffffe60);
        if (!bVar3) {
          bVar3 = fail(in_RDI);
          return bVar3;
        }
      }
      pEVar6 = BinaryExpression::right(local_c8);
      bVar3 = ValueExpressionBase::isKind(pEVar6->kind);
      if (bVar3) {
        BinaryExpression::right(local_c8);
        bVar3 = checkType((ConstraintExprVisitor *)
                          CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68),
                          in_stack_fffffffffffffe60);
        if (!bVar3) {
          bVar3 = fail(in_RDI);
          return bVar3;
        }
      }
    }
    break;
  case 0x10:
  case 0x20:
  case 0x21:
  case 0x23:
    local_3e = 0x180008;
    local_50 = (local_18->sourceRange).startLoc;
    local_48 = (local_18->sourceRange).endLoc;
    sourceRange_00.endLoc._0_7_ = in_stack_fffffffffffffe68;
    sourceRange_00.startLoc = (SourceLocation)in_stack_fffffffffffffe60;
    sourceRange_00.endLoc._7_1_ = in_stack_fffffffffffffe6f;
    ASTContext::addDiag((ASTContext *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),
                        (DiagCode)0x0,sourceRange_00);
    bVar3 = fail(in_RDI);
    return bVar3;
  case 0x14:
    local_118 = Expression::as<slang::ast::CallExpression>(local_18);
    SVar5 = CallExpression::getSubroutineKind
                      ((CallExpression *)
                       CONCAT44(in_stack_fffffffffffffe4c,
                                CONCAT13(in_stack_fffffffffffffe4b,
                                         CONCAT12(in_stack_fffffffffffffe4a,
                                                  in_stack_fffffffffffffe48))));
    if (SVar5 == Task) {
      local_11c = 0x4b0008;
      local_130 = (local_18->sourceRange).startLoc;
      local_128 = (local_18->sourceRange).endLoc;
      sourceRange_06.endLoc._0_7_ = in_stack_fffffffffffffe68;
      sourceRange_06.startLoc = (SourceLocation)in_stack_fffffffffffffe60;
      sourceRange_06.endLoc._7_1_ = in_stack_fffffffffffffe6f;
      ASTContext::addDiag((ASTContext *)
                          CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),
                          SUB84(uVar9 >> 0x20,0),sourceRange_06);
      bVar3 = fail(in_RDI);
      return bVar3;
    }
    bVar3 = CallExpression::isSystemCall((CallExpression *)0x96b938);
    if (!bVar3) {
      ppSVar7 = std::
                get<0ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                          ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                            *)0x96b951);
      local_138 = *ppSVar7;
      local_150 = SubroutineSymbol::getArguments(in_stack_fffffffffffffe38);
      local_140 = &local_150;
      local_158._M_current =
           (FormalArgumentSymbol **)
           std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::begin
                     ((span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> *
                      )in_stack_fffffffffffffe38);
      std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::end
                ((span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> *)
                 CONCAT44(in_stack_fffffffffffffe4c,
                          CONCAT13(in_stack_fffffffffffffe4b,
                                   CONCAT12(in_stack_fffffffffffffe4a,in_stack_fffffffffffffe48))));
      while (bVar3 = __gnu_cxx::
                     operator==<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                               ((__normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                                 *)in_stack_fffffffffffffe40,
                                (__normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                                 *)in_stack_fffffffffffffe38), ((bVar3 ^ 0xffU) & 1) != 0) {
        ppFVar8 = __gnu_cxx::
                  __normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                  ::operator*(&local_158);
        pFVar2 = *ppFVar8;
        bVar10 = 1;
        if (((pFVar2->direction != Out) && (bVar10 = 1, pFVar2->direction != InOut)) &&
           (bVar10 = 0, pFVar2->direction == Ref)) {
          in_stack_fffffffffffffe40 = (Expression *)&(pFVar2->super_VariableSymbol).flags;
          bitmask<slang::ast::VariableFlags>::bitmask
                    ((bitmask<slang::ast::VariableFlags> *)&stack0xfffffffffffffe96,Const);
          bVar3 = bitmask<slang::ast::VariableFlags>::has
                            ((bitmask<slang::ast::VariableFlags> *)in_stack_fffffffffffffe40,
                             (bitmask<slang::ast::VariableFlags> *)in_stack_fffffffffffffe38);
          bVar10 = bVar3 ^ 0xff;
        }
        if ((bVar10 & 1) != 0) {
          sourceRange_07.endLoc._0_7_ = in_stack_fffffffffffffe68;
          sourceRange_07.startLoc = (SourceLocation)in_stack_fffffffffffffe60;
          sourceRange_07.endLoc._7_1_ = in_stack_fffffffffffffe6f;
          ASTContext::addDiag((ASTContext *)
                              CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),
                              SUB84(uVar9 >> 0x20,0),sourceRange_07);
          bVar3 = fail(in_RDI);
          return bVar3;
        }
        __gnu_cxx::
        __normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
        ::operator++(&local_158);
      }
    }
    break;
  case 0x1e:
    return true;
  case 0x1f:
    DistVarVisitor::DistVarVisitor(&local_f0,in_RDI->context);
    DVar12 = SUB84(uVar9 >> 0x20,0);
    this_00 = Expression::as<slang::ast::DistExpression>(local_18);
    local_f8 = DistExpression::left(this_00);
    Expression::visit<slang::ast::DistVarVisitor&>
              (in_stack_fffffffffffffe40,(DistVarVisitor *)in_stack_fffffffffffffe38);
    if ((local_f0.anyRandVars & 1U) == 0) {
      local_fc = 0x3c0008;
      local_110 = (local_f8->sourceRange).startLoc;
      local_108 = (local_f8->sourceRange).endLoc;
      sourceRange_05.endLoc._0_7_ = in_stack_fffffffffffffe68;
      sourceRange_05.startLoc = (SourceLocation)in_stack_fffffffffffffe60;
      sourceRange_05.endLoc._7_1_ = in_stack_fffffffffffffe6f;
      ASTContext::addDiag((ASTContext *)
                          CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),DVar12,
                          sourceRange_05);
    }
    return true;
  }
  bVar3 = checkType((ConstraintExprVisitor *)
                    CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68),
                    in_stack_fffffffffffffe60);
  if (bVar3) {
    local_1 = true;
  }
  else {
    local_1 = fail(in_RDI);
  }
  return local_1;
}

Assistant:

bool visit(const T& expr) {
        if (failed || expr.bad())
            return fail();

        if constexpr (std::is_base_of_v<Expression, T>) {
            if (auto sym = expr.getSymbolReference()) {
                RandMode mode = context.getRandMode(*sym);
                if (mode != RandMode::None)
                    sawRandVars = true;

                if (isSoft && mode == RandMode::RandC)
                    context.addDiag(diag::RandCInSoft, expr.sourceRange);
            }

            bool childrenHaveRand = false;

            if constexpr (HasVisitExprs<T, ConstraintExprVisitor>) {
                // Inside call and select expressions we don't care about the types.
                // This allows things like selections of associative arrays and built-in methods
                // on arrays of strings to work as long as the actual operators at the top level
                // don't have those types.
                if (expr.kind != ExpressionKind::ElementSelect &&
                    expr.kind != ExpressionKind::MemberAccess &&
                    expr.kind != ExpressionKind::Call) {

                    const bool oldTop = std::exchange(isTop, false);
                    const bool oldSawRand = std::exchange(sawRandVars, false);
                    expr.visitExprs(*this);
                    isTop = oldTop;
                    childrenHaveRand = sawRandVars;
                    sawRandVars = oldSawRand;
                }
            }

            switch (expr.kind) {
                case ExpressionKind::Streaming:
                case ExpressionKind::NewArray:
                case ExpressionKind::NewClass:
                case ExpressionKind::CopyClass:
                    context.addDiag(diag::ExprNotConstraint, expr.sourceRange);
                    return fail();
                case ExpressionKind::RealLiteral:
                case ExpressionKind::TimeLiteral:
                    if (context.getCompilation().languageVersion() < LanguageVersion::v1800_2023) {
                        context.addDiag(diag::NonIntegralConstraintLiteral, expr.sourceRange);
                        return fail();
                    }
                    break;
                case ExpressionKind::IntegerLiteral:
                    if (expr.template as<IntegerLiteral>().getValue().hasUnknown()) {
                        context.addDiag(diag::UnknownConstraintLiteral, expr.sourceRange);
                        return fail();
                    }
                    return true;
                case ExpressionKind::UnbasedUnsizedIntegerLiteral:
                    if (expr.template as<UnbasedUnsizedIntegerLiteral>().getValue().hasUnknown()) {
                        context.addDiag(diag::UnknownConstraintLiteral, expr.sourceRange);
                        return fail();
                    }
                    return true;
                case ExpressionKind::BinaryOp: {
                    auto& binExpr = expr.template as<BinaryExpression>();
                    switch (binExpr.op) {
                        case BinaryOperator::CaseEquality:
                        case BinaryOperator::CaseInequality:
                        case BinaryOperator::WildcardEquality:
                        case BinaryOperator::WildcardInequality:
                            context.addDiag(diag::ExprNotConstraint, expr.sourceRange);
                            return fail();
                        case BinaryOperator::Equality:
                        case BinaryOperator::Inequality:
                        case BinaryOperator::GreaterThanEqual:
                        case BinaryOperator::GreaterThan:
                        case BinaryOperator::LessThanEqual:
                        case BinaryOperator::LessThan:
                        case BinaryOperator::LogicalAnd:
                        case BinaryOperator::LogicalOr:
                        case BinaryOperator::LogicalImplication:
                        case BinaryOperator::LogicalEquivalence:
                            // We previously ignored invalid types of NamedValues when
                            // we visited subexpressions. If there were any rand vars
                            // used in our subexpressions we should re-check named values
                            // for the stricter integral / numeric type requirements.
                            if (childrenHaveRand) {
                                if (ValueExpressionBase::isKind(binExpr.left().kind) &&
                                    !checkType(binExpr.left())) {
                                    return fail();
                                }

                                if (ValueExpressionBase::isKind(binExpr.right().kind) &&
                                    !checkType(binExpr.right())) {
                                    return fail();
                                }
                            }
                            break;
                        default:
                            break;
                    }
                    break;
                }
                case ExpressionKind::NamedValue:
                case ExpressionKind::HierarchicalValue:
                    if (!isTop)
                        return true;
                    break;
                case ExpressionKind::ValueRange:
                    return true;
                case ExpressionKind::Dist: {
                    // Additional restrictions on dist expressions:
                    // - must contain at least one 'rand' var
                    // - cannot contain any 'randc' vars
                    DistVarVisitor distVisitor(context);
                    auto& left = expr.template as<DistExpression>().left();
                    left.visit(distVisitor);
                    if (!distVisitor.anyRandVars)
                        context.addDiag(diag::RandNeededInDist, left.sourceRange);
                    return true;
                }
                case ExpressionKind::Call: {
                    auto& call = expr.template as<CallExpression>();
                    if (call.getSubroutineKind() == SubroutineKind::Task) {
                        context.addDiag(diag::TaskInConstraint, expr.sourceRange);
                        return fail();
                    }

                    if (!call.isSystemCall()) {
                        const SubroutineSymbol& sub = *std::get<0>(call.subroutine);
                        for (auto arg : sub.getArguments()) {
                            if (arg->direction == ArgumentDirection::Out ||
                                arg->direction == ArgumentDirection::InOut ||
                                (arg->direction == ArgumentDirection::Ref &&
                                 !arg->flags.has(VariableFlags::Const))) {
                                context.addDiag(diag::OutRefFuncConstraint, expr.sourceRange);
                                return fail();
                            }
                        }
                    }
                    break;
                }
                default:
                    break;
            }

            if (!checkType(expr))
                return fail();
        }

        return true;
    }